

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O3

char * construct_at_path_from_parts(Dwarf_Macro_Context mc)

{
  Dwarf_Small *fname;
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s_00;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  
  if (mc->mc_file_path != (char *)0x0) {
    return mc->mc_file_path;
  }
  if ((mc->mc_at_comp_dir != (char *)0x0) && (*mc->mc_at_comp_dir != '\0')) {
    fname = (Dwarf_Small *)mc->mc_at_name;
    if ((fname == (Dwarf_Small *)0x0) || (*fname == '\0')) {
      return (char *)0x0;
    }
    iVar1 = _dwarf_file_name_is_full_path(fname);
    if (iVar1 == 0) {
      pcVar7 = mc->mc_at_comp_dir;
      __s = mc->mc_at_name;
      sVar2 = strlen(pcVar7);
      sVar3 = strlen(__s);
      __s_00 = (char *)malloc(sVar2 + sVar3 + 2);
      if (__s_00 != (char *)0x0) {
        *__s_00 = '\0';
        cVar4 = *pcVar7;
        pcVar5 = __s_00;
        while (cVar4 != '\0') {
          pcVar7 = pcVar7 + 1;
          *pcVar5 = cVar4;
          pcVar5 = pcVar5 + 1;
          cVar4 = *pcVar7;
        }
        *pcVar5 = '\0';
        sVar2 = strlen(__s_00);
        (__s_00 + sVar2)[0] = '/';
        (__s_00 + sVar2)[1] = '\0';
        pcVar7 = __s_00;
        do {
          pcVar5 = pcVar7;
          pcVar7 = pcVar5 + 1;
        } while (*pcVar5 != '\0');
        cVar4 = *__s;
        if (cVar4 != '\0') {
          lVar6 = -1;
          do {
            pcVar7[lVar6] = cVar4;
            cVar4 = __s[lVar6 + 2];
            lVar6 = lVar6 + 1;
          } while (cVar4 != '\0');
          pcVar5 = pcVar7 + lVar6;
        }
        *pcVar5 = '\0';
      }
      mc->mc_file_path = __s_00;
      return __s_00;
    }
  }
  return mc->mc_at_name;
}

Assistant:

static const char *
construct_at_path_from_parts(Dwarf_Macro_Context mc)
{
    if (mc->mc_file_path) {
        return mc->mc_file_path;
    }
    if (!mc->mc_at_comp_dir || !mc->mc_at_comp_dir[0]) {
        return mc->mc_at_name;
    }
    if (!mc->mc_at_name || !mc->mc_at_name[0]) {
        return NULL;
    }
    if (_dwarf_file_name_is_full_path(
        (Dwarf_Small *)mc->mc_at_name)) {
        return mc->mc_at_name;
    }
    /* Dwarf_Macro_Context destructor will free this. */
    mc->mc_file_path = construct_from_dir_and_name(
        mc->mc_at_comp_dir,mc->mc_at_name);
    return mc->mc_file_path;
}